

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_string.c
# Opt level: O3

int lj_ffh_string_rep(lua_State *L)

{
  bool bVar1;
  uint uVar2;
  GCstr *pGVar3;
  GCstr *pGVar4;
  void *p;
  ulong uVar5;
  uint uVar6;
  int32_t i;
  ulong uVar7;
  uint32_t uVar8;
  ulong uVar9;
  long lVar10;
  size_t lenx;
  MSize MVar11;
  uint uVar12;
  TValue *pTVar13;
  GCstr *pGVar14;
  
  pGVar3 = lj_lib_checkstr(L,1);
  uVar2 = lj_lib_checkint(L,2);
  if ((L->base + 2 < L->top) && (*(int *)((long)L->base + 0x14) != -1)) {
    pGVar4 = lj_lib_checkstr(L,3);
  }
  else {
    pGVar4 = (GCstr *)0x0;
  }
  uVar6 = (L->glref).ptr32;
  uVar9 = (ulong)uVar6;
  if (0 < (int)uVar2) {
    uVar12 = pGVar3->len;
    if (pGVar4 == (GCstr *)0x0) {
      lenx = (long)(int)uVar12 * (ulong)uVar2;
    }
    else {
      lVar10 = (ulong)pGVar4->len + (long)(int)uVar12;
      if (0x7fffff00 < lVar10) goto LAB_00144722;
      lenx = lVar10 * (ulong)uVar2;
    }
    if (0x7fffff00 < (long)lenx) {
LAB_00144722:
      lj_err_caller(L,LJ_ERR_STROV);
    }
    if (lenx != 0) {
      p = *(void **)(uVar9 + 0x58);
      uVar6 = (uint)lenx;
      if (*(uint *)(uVar9 + 100) < uVar6) {
        MVar11 = 0x20;
        if (0x20 < uVar6) {
          MVar11 = uVar6;
        }
        p = lj_mem_realloc(L,p,*(uint *)(uVar9 + 100),MVar11);
        *(void **)(uVar9 + 0x58) = p;
        *(MSize *)(uVar9 + 100) = MVar11;
      }
      pGVar14 = pGVar3 + 1;
      uVar6 = uVar2;
      if (pGVar4 != (GCstr *)0x0) {
        MVar11 = pGVar4->len;
        lenx = lenx - MVar11;
        uVar6 = 1;
        if (uVar2 != 1) {
          if (0 < (int)uVar12) {
            uVar5 = 0;
            do {
              *(undefined1 *)((long)p + uVar5) =
                   *(undefined1 *)((long)&(pGVar14->nextgc).gcptr32 + uVar5);
              uVar5 = uVar5 + 1;
            } while (uVar12 != uVar5);
            MVar11 = pGVar4->len;
            p = (void *)((long)p + uVar5);
          }
          if (0 < (int)MVar11) {
            uVar5 = 0;
            do {
              *(undefined1 *)((long)p + uVar5) =
                   *(undefined1 *)((long)&pGVar4[1].nextgc.gcptr32 + uVar5);
              uVar5 = uVar5 + 1;
            } while (MVar11 != uVar5);
            p = (void *)((long)p + uVar5);
          }
          pGVar14 = *(GCstr **)(uVar9 + 0x58);
          uVar12 = MVar11 + pGVar3->len;
          uVar6 = uVar2 - 1;
        }
      }
      uVar5 = 1;
      if (1 < (int)uVar12) {
        uVar5 = (ulong)uVar12;
      }
      do {
        uVar7 = 0;
        do {
          *(undefined1 *)((long)p + uVar7) =
               *(undefined1 *)((long)&(pGVar14->nextgc).gcptr32 + uVar7);
          uVar7 = uVar7 + 1;
        } while (uVar5 != uVar7);
        p = (void *)((long)p + uVar7);
        bVar1 = 1 < (int)uVar6;
        uVar6 = uVar6 - 1;
      } while (bVar1);
      pTVar13 = L->base;
      pGVar3 = lj_str_new(L,*(char **)(uVar9 + 0x58),lenx);
      uVar8 = (uint32_t)pGVar3;
      goto LAB_0014479e;
    }
  }
  pTVar13 = L->base;
  uVar8 = uVar6 + 0x80;
LAB_0014479e:
  pTVar13[-1].u32.lo = uVar8;
  *(undefined4 *)((long)pTVar13 + -4) = 0xfffffffb;
  return 2;
}

Assistant:

LJLIB_ASM(string_rep)
{
  GCstr *s = lj_lib_checkstr(L, 1);
  int32_t k = lj_lib_checkint(L, 2);
  GCstr *sep = lj_lib_optstr(L, 3);
  int32_t len = (int32_t)s->len;
  global_State *g = G(L);
  int64_t tlen;
  const char *src;
  char *buf;
  if (k <= 0) {
  empty:
    setstrV(L, L->base-1, &g->strempty);
    return FFH_RES(1);
  }
  if (sep) {
    tlen = (int64_t)len + sep->len;
    if (tlen > LJ_MAX_STR)
      lj_err_caller(L, LJ_ERR_STROV);
    tlen *= k;
    if (tlen > LJ_MAX_STR)
      lj_err_caller(L, LJ_ERR_STROV);
  } else {
    tlen = (int64_t)k * len;
    if (tlen > LJ_MAX_STR)
      lj_err_caller(L, LJ_ERR_STROV);
  }
  if (tlen == 0) goto empty;
  buf = lj_str_needbuf(L, &g->tmpbuf, (MSize)tlen);
  src = strdata(s);
  if (sep) {
    tlen -= sep->len;  /* Ignore trailing separator. */
    if (k > 1) {  /* Paste one string and one separator. */
      int32_t i;
      i = 0; while (i < len) *buf++ = src[i++];
      src = strdata(sep); len = sep->len;
      i = 0; while (i < len) *buf++ = src[i++];
      src = g->tmpbuf.buf; len += s->len; k--;  /* Now copy that k-1 times. */
    }
  }
  do {
    int32_t i = 0;
    do { *buf++ = src[i++]; } while (i < len);
  } while (--k > 0);
  setstrV(L, L->base-1, lj_str_new(L, g->tmpbuf.buf, (size_t)tlen));
  return FFH_RES(1);
}